

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_shrinkToFit_success_hasNotLeastCapacity_fn(int _i)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  code *local_48;
  code *pcStack_40;
  code *local_38;
  size_t local_30;
  size_t local_28;
  void *local_20;
  long lVar10;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = 7;
  local_28 = private_ACUtils_ADynArray_growStrategyGeneric(9,8,0x20,2.0,0x20);
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  local_20 = private_ACUtilsTest_ADynArray_realloc((void *)0x0,local_28);
  auVar11 = _DAT_00157020;
  lVar2 = 1;
  auVar9 = _DAT_00157010;
  do {
    if (SUB164(auVar9 ^ auVar11,4) == -0x80000000 && SUB164(auVar9 ^ auVar11,0) < -0x7ffffffa) {
      *(undefined1 *)((long)local_20 + lVar2 + -1) = 0x35;
      *(undefined1 *)((long)local_20 + lVar2) = 0x35;
    }
    lVar10 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 2;
    auVar9._8_8_ = lVar10 + 2;
    lVar2 = lVar2 + 2;
  } while (lVar2 != 7);
  *(undefined1 *)((long)local_20 + 6) = 0x30;
  local_38 = private_ACUtilsTest_ADynArray_growStrategy;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_shrinkToFit(&local_48,1);
  if (bVar1 == true) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x18d);
    if (local_30 != 7) {
      pcVar8 = "private_ACUtilsTest_ADynArray_capacityMin - 1";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar5 = "array.size == private_ACUtilsTest_ADynArray_capacityMin - 1";
      pcVar6 = "array.size";
      iVar4 = 0x18e;
      auVar11 = ZEXT816(7);
      sVar7 = local_30;
      goto LAB_0010c938;
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x18e);
    if (local_28 != 8) {
      pcVar8 = "private_ACUtilsTest_ADynArray_capacityMin";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar5 = "array.capacity == private_ACUtilsTest_ADynArray_capacityMin";
      pcVar6 = "array.capacity";
      iVar4 = 399;
      auVar11 = ZEXT816(8);
      sVar7 = local_28;
      goto LAB_0010c938;
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,399);
    if (local_20 == (void *)0x0) {
      pcVar5 = "(void*) array.buffer != NULL";
      pcVar6 = "(void*) array.buffer";
      iVar4 = 400;
LAB_0010ca8f:
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,iVar4,"Assertion \'_ck_x != NULL\' failed",
                        "Assertion \'%s\' failed: %s == %#x",pcVar5,pcVar6,(undefined1  [16])0x0);
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,400);
    lVar2 = 0;
    do {
      if ((long)*(char *)((long)local_20 + lVar2) != 0x35) {
        pcVar8 = "\'5\'";
        pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
        pcVar5 = "array.buffer[i] == \'5\'";
        pcVar6 = "array.buffer[i]";
        iVar4 = 0x192;
        auVar11 = ZEXT816(0x35);
        sVar7 = (long)*(char *)((long)local_20 + lVar2);
        goto LAB_0010c938;
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x192);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 6);
    if ((long)*(char *)((long)local_20 + 6) != 0x30) {
      pcVar8 = "\'0\'";
      pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
      pcVar5 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 2] == \'0\'";
      pcVar6 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 2]";
      iVar4 = 0x193;
      auVar11 = ZEXT816(0x30);
      sVar7 = (long)*(char *)((long)local_20 + 6);
      goto LAB_0010c938;
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x193);
    if (local_38 == (code *)0x0) {
      pcVar5 = "(void*) array.growStrategy != NULL";
      pcVar6 = "(void*) array.growStrategy";
      iVar4 = 0x194;
      goto LAB_0010ca8f;
    }
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x194);
    if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x195);
      (*pcStack_40)(local_20);
      return;
    }
    pcVar8 = "1";
    pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount == 1";
    pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount";
    iVar4 = 0x195;
    sVar7 = private_ACUtilsTest_ADynArray_reallocCount;
  }
  else {
    sVar7 = (size_t)bVar1;
    pcVar8 = "true";
    pcVar5 = "private_ACUtils_ADynArray_shrinkToFit(&array, sizeof(*(&array)->buffer)) == true";
    pcVar6 = "private_ACUtils_ADynArray_shrinkToFit(&array, sizeof(*(&array)->buffer))";
    iVar4 = 0x18d;
  }
  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  auVar11 = ZEXT816(1);
LAB_0010c938:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar4,"Assertion \'_ck_x == _ck_y\' failed",pcVar3,pcVar5,pcVar6,sVar7,pcVar8,
                    auVar11);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_shrinkToFit_success_hasNotLeastCapacity)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin - 1;
    array.capacity = private_ACUtilsTest_ADynArray_growStrategy(private_ACUtilsTest_ADynArray_capacityMin + 1, sizeof(char));
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_shrinkToFit(&array), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin - 1);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 2; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 2], '0');
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    array.deallocator(array.buffer);
}